

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O1

void list_split_anything(t_list_split *x,t_symbol *s,int argc,t_atom *argv)

{
  uint argc_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  t_atom *argv_00;
  long lVar4;
  t_atom *ptVar5;
  t_symbol *ptVar6;
  undefined1 auStack_38 [8];
  
  ptVar5 = (t_atom *)auStack_38;
  argc_00 = argc + 1;
  ptVar6 = s;
  if (argc < 99) {
    ptVar5 = (t_atom *)(auStack_38 + (long)(int)argc_00 * -0x10);
    argv_00 = ptVar5;
  }
  else {
    argv_00 = (t_atom *)getbytes((ulong)argc_00 << 4);
  }
  argv_00->a_type = A_SYMBOL;
  (argv_00->a_w).w_symbol = s;
  if (0 < argc) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)((long)&argv->a_type + lVar4);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&argv_00[1].a_type + lVar4);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)argc << 4 != lVar4);
  }
  ptVar5[-1].a_w.w_symbol = (t_symbol *)0x1854dd;
  list_split_list(x,ptVar6,argc_00,argv_00);
  if (0x62 < argc) {
    ptVar5[-1].a_w.w_symbol = (t_symbol *)0x1854f1;
    freebytes(argv_00,(ulong)argc_00 << 4);
  }
  return;
}

Assistant:

static void list_split_anything(t_list_split *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_atom *outv;
    ATOMS_ALLOCA(outv, argc+1);
    SETSYMBOL(outv, s);
    atoms_copy(argc, argv, outv + 1);
    list_split_list(x, &s_list, argc+1, outv);
    ATOMS_FREEA(outv, argc+1);
}